

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Generators::Generators<unary_op_tuple<trng::portable_impl::uint128,_double>_>::populate
          (Generators<unary_op_tuple<trng::portable_impl::uint128,_double>_> *this,
          unary_op_tuple<trng::portable_impl::uint128,_double> *val)

{
  unary_op_tuple<trng::portable_impl::uint128,_double> *in_stack_00000008;
  GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,_double>_> *in_stack_ffffffffffffffd8
  ;
  vector<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,_double>_>,_std::allocator<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,_double>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  value<unary_op_tuple<trng::portable_impl::uint128,double>>(in_stack_00000008);
  std::
  vector<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,double>>,std::allocator<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,double>>>>
  ::
  emplace_back<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,double>>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,_double>_>::~GeneratorWrapper
            ((GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,_double>_> *)0x431209);
  return;
}

Assistant:

void populate(T&& val) {
            m_generators.emplace_back(value(std::forward<T>(val)));
        }